

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_print.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  kvtree *pkVar5;
  int iVar6;
  undefined8 uStack_60;
  int local_58;
  char *local_48;
  kvtree *hash;
  int long_index;
  
  long_index = 0;
  iVar4 = 1;
  local_48 = (char *)0x0;
  local_58 = 0;
  iVar2 = 0;
  while( true ) {
    do {
      iVar6 = iVar2;
      iVar3 = getopt_long(argc,argv,"m:h",main::long_options,&long_index);
      iVar2 = iVar4;
    } while (iVar3 == 0x68);
    if (iVar3 == -1) break;
    if (iVar3 == 0x6d) {
      local_48 = strdup(_optarg);
      iVar2 = iVar6;
    }
    else {
      printf("ERROR: Unknown option: `%s\'\n",argv[(long)_optind + -1]);
      local_58 = iVar4;
    }
  }
  if ((iVar6 == 0) && (argc - _optind != 1)) {
    puts("ERROR: Missing file name or too many files");
    iVar6 = 1;
    local_58 = iVar6;
  }
  if (local_48 == (char *)0x0) {
    uStack_60 = 1;
  }
  else {
    iVar4 = strcmp(local_48,"tree");
    if (iVar4 == 0) {
      uStack_60 = 1;
    }
    else {
      iVar4 = strcmp(local_48,"keyval");
      if (iVar4 == 0) {
        uStack_60 = 2;
      }
      else {
        printf("ERROR: Invalid mode name: `%s\'\n",local_48);
        iVar6 = 1;
        uStack_60 = 1;
        local_58 = iVar6;
      }
    }
    free(local_48);
  }
  if (iVar6 == 0) {
    pcVar1 = argv[_optind];
    pkVar5 = (kvtree *)kvtree_new();
    hash = pkVar5;
    iVar4 = kvtree_read_file(pcVar1,pkVar5);
    if (iVar4 == 0) {
      kvtree_print_mode(pkVar5,0,uStack_60);
    }
    else {
      printf("ERROR: Failed to read file: `%s\'\n",pcVar1);
      local_58 = 1;
    }
    kvtree_delete(&hash);
  }
  else {
    putchar(10);
    puts("Usage: kvtree_print [options] <file>");
    putchar(10);
    puts("  Options:");
    puts("    -m, --mode <mode>  Specify print format: \"tree\" or \"keyval\" (default tree)");
    puts("    -h, --help         Print usage");
    putchar(10);
  }
  return local_58;
}

Assistant:

int main(int argc, char* argv[])
{
  int rc = 0;

  static const char *opt_string = "m:h";
  static struct option long_options[] = {
    {"mode",    required_argument, NULL, 'm'},
    {"help",    no_argument,       NULL, 'h'},
    {NULL,      no_argument,       NULL,   0}
  };

  int usage = 0;
  char* mode = NULL;

  int long_index = 0;
  while (1) {
    int c = getopt_long(argc, argv, opt_string, long_options, &long_index);
    if (c == -1) {
      break;
    }

    switch(c) {
      case 'm':
        mode = strdup(optarg);
        break;
      case 'h':
        usage = 1;
        break;
      default:
        printf("ERROR: Unknown option: `%s'\n", argv[optind-1]);
        usage = 1;
        rc = 1;
        break;
    }
  }

  /* check that we were given exactly one filename argument */
  int numargs = argc - optind;
  if (!usage && numargs != 1) {
    printf("ERROR: Missing file name or too many files\n");
    usage = 1;
    rc = 1;
  }

  /* parse the print mode option, if one is given */
  int print_mode = KVTREE_PRINT_TREE;
  if (mode != NULL) {
    if (strcmp(mode, "tree") == 0) {
      print_mode = KVTREE_PRINT_TREE;
    } else if (strcmp(mode, "keyval") == 0) {
      print_mode = KVTREE_PRINT_KEYVAL;
    } else {
      printf("ERROR: Invalid mode name: `%s'\n", mode);
      usage = 1;
      rc = 1;
    }
    free(mode);
  }

  if (usage) {
    print_usage();
    return rc;
  }

  /* get the file name */
  char* filename = argv[optind];

  /* read in the file */
  kvtree* hash = kvtree_new();
  if (kvtree_read_file(filename, hash) == KVTREE_SUCCESS) {
    /* we read the file, now print it out */
    kvtree_print_mode(hash, 0, print_mode);
  } else {
    printf("ERROR: Failed to read file: `%s'\n", filename);
    rc = 1;
  }
  kvtree_delete(&hash);

  return rc;
}